

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::RecursiveMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar3;
  int line;
  Arena *arena;
  Arena *arena_00;
  RecursiveMessage *_this;
  RecursiveMessage *local_30;
  LogMessageFatal local_28;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  local_30 = (RecursiveMessage *)to_msg;
  local_28.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::RecursiveMessage_const*,proto2_unittest::RecursiveMessage*>
                          ((RecursiveMessage **)&local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        arena = (Arena *)(local_30->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.payload_,(string *)(uVar2 & 0xfffffffffffffffc),arena
                  );
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.recurse_ != nullptr";
          line = 0x3409;
          goto LAB_00ab43be;
        }
        to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x10);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar3 = google::protobuf::Arena::CopyConstruct<proto2_unittest::RecursiveMessage>
                             (arena_00,from_msg_00);
          *(void **)((long)&local_30->field_0 + 0x10) = pvVar3;
        }
        else {
          MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_30->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  line = 0x33ff;
LAB_00ab43be:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void RecursiveMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<RecursiveMessage*>(&to_msg);
  auto& from = static_cast<const RecursiveMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.RecursiveMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_payload(from._internal_payload());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.recurse_ != nullptr);
      if (_this->_impl_.recurse_ == nullptr) {
        _this->_impl_.recurse_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.recurse_);
      } else {
        _this->_impl_.recurse_->MergeFrom(*from._impl_.recurse_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}